

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O3

int katherine_configure(katherine_device_t *device,katherine_config_t *config)

{
  int iVar1;
  
  iVar1 = katherine_set_all_pixel_config(device,&config->pixel_config);
  if (iVar1 == 0) {
    iVar1 = katherine_set_acq_time(device,config->acq_time);
    if (iVar1 == 0) {
      iVar1 = katherine_set_no_frames(device,config->no_frames);
      if (iVar1 == 0) {
        iVar1 = katherine_set_bias(device,'\0',config->bias);
        if (iVar1 == 0) {
          iVar1 = katherine_acquisition_setup
                            (device,&config->start_trigger,config->delayed_start,
                             &config->stop_trigger);
          if (iVar1 == 0) {
            iVar1 = katherine_set_sensor_register(device,'\x04',config->polarity_holes ^ 0x59);
            if (iVar1 == 0) {
              iVar1 = katherine_set_sensor_register
                                (device,'\x03',
                                 (config->phase & (PHASE_16|PHASE_8)) * 0x40 +
                                 (config->freq & FREQ_160) * 0x10 + 0x280e);
              if (iVar1 == 0) {
                iVar1 = katherine_output_block_config_update(device);
                if (iVar1 == 0) {
                  iVar1 = katherine_update_sensor_registers(device);
                  if (iVar1 == 0) {
                    iVar1 = katherine_timer_set(device);
                    if (iVar1 == 0) {
                      iVar1 = katherine_set_dacs(device,&config->dacs);
                      return iVar1;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int
katherine_configure(katherine_device_t *device, const katherine_config_t *config)
{
    int res;

    res = katherine_set_all_pixel_config(device, &config->pixel_config);
    if (res) goto err;

    res = katherine_set_acq_time(device, config->acq_time);
    if (res) goto err;

    res = katherine_set_no_frames(device, config->no_frames);
    if (res) goto err;

    res = katherine_set_bias(device, config->bias_id, config->bias);
    if (res) goto err;

    res = katherine_acquisition_setup(device, &config->start_trigger, config->delayed_start, &config->stop_trigger);
    if (res) goto err;

    int32_t general_setup = 0x58;
    general_setup |= !config->polarity_holes;
    general_setup |= (config->gray_disable ? 1 : 0) << 3;
    res = katherine_set_sensor_register(device, TPX3_REG_GENERAL_CONFIG, general_setup);
    if (res) goto err;

    int32_t pll_setup = 0xE;
    pll_setup |= (0x7 & config->phase) << 6;
    pll_setup |= (0x3 & config->freq) << 4;
    pll_setup |= 0x14 << 9;
    res = katherine_set_sensor_register(device, TPX3_REG_PLL_CONFIG, pll_setup);
    if (res) goto err;

    res = katherine_output_block_config_update(device);
    if (res) goto err;

    res = katherine_update_sensor_registers(device);
    if (res) goto err;

    res = katherine_timer_set(device);
    if (res) goto err;

    res = katherine_set_dacs(device, &config->dacs);
    if (res) goto err;

    return 0;

err:
    return res;
}